

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

uint8_t penguinV::GetPixel(Image *image,uint32_t x,uint32_t y)

{
  bool bVar1;
  uint8_t uVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  reference puVar4;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  ImageManager manager;
  GetPixelForm1 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  GetPixelForm1 func;
  ImageTypeManager *registrator;
  undefined7 in_stack_fffffffffffffef8;
  uint8_t in_stack_fffffffffffffeff;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  FunctionTableHolder *in_stack_ffffffffffffff10;
  ImageManager *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  ImageTypeManager *in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  undefined1 local_48 [24];
  undefined1 *local_30;
  uint8_t local_21;
  GetPixelForm1 local_20;
  
  this = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_20 = pFVar3->GetPixel;
  local_21 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_20 == (GetPixelForm1)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_30 = local_48;
    local_50._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_50);
      in_stack_ffffffffffffff10 =
           ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      if (in_stack_ffffffffffffff10->GetPixel != (GetPixelForm1)0x0) {
        local_20 = in_stack_ffffffffffffff10->GetPixel;
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_50);
        local_21 = *puVar4;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_50);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff10);
  }
  (anonymous_namespace)::
  verifyFunction<unsigned_char(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int)>
            ((_func_uchar_ImageTemplate<unsigned_char>_ptr_uint_uint *)CONCAT44(in_ESI,in_EDX),
             (char *)this);
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffeff);
  uVar2 = (*local_20)(in_RDI,in_ESI,in_EDX);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager(in_stack_ffffffffffffff30);
  return uVar2;
}

Assistant:

uint8_t GetPixel( const Image & image, uint32_t x, uint32_t y )
    {
        initialize( image, GetPixel );
        return func( image, x, y );
    }